

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O0

void __thiscall
SimpleBVH::BVH::leaf_callback(BVH *this,VectorMax3d *p,int f,VectorMax3d *np,double *sq_d)

{
  VectorMax3d *pVVar1;
  bool bVar2;
  Index IVar3;
  CoeffReturnType piVar4;
  ConstRowXpr local_1e8;
  ConstRowXpr local_1b0;
  ConstRowXpr local_178;
  undefined1 local_140 [64];
  Matrix<double,_1,1,0,3,1> aMStack_100 [32];
  ConstRowXpr local_e0;
  ConstRowXpr local_a8;
  undefined1 local_70 [64];
  double *local_30;
  double *sq_d_local;
  VectorMax3d *np_local;
  VectorMax3d *pVStack_18;
  int f_local;
  VectorMax3d *p_local;
  BVH *this_local;
  
  local_30 = sq_d;
  sq_d_local = (double *)np;
  np_local._4_4_ = f;
  pVStack_18 = p;
  p_local = (VectorMax3d *)this;
  bVar2 = std::function::operator_cast_to_bool((function *)&this->leafCallback);
  if (bVar2) {
    std::
    function<void_(const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_&,_int,_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_&,_double_&)>
    ::operator()(&this->leafCallback,pVStack_18,np_local._4_4_,
                 (Matrix<double,__1,_1,_0,_3,_1> *)sq_d_local,local_30);
  }
  else {
    IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&(this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>)
    ;
    pVVar1 = pVStack_18;
    if (IVar3 == 2) {
      piVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)&this->faces,
                          (long)np_local._4_4_,0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_a8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->vertices,
                 (long)*piVar4);
      Eigen::Matrix<double,-1,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
                ((Matrix<double,_1,1,0,3,1> *)local_70,
                 (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)&local_a8);
      piVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)&this->faces,
                          (long)np_local._4_4_,1);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_e0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->vertices,
                 (long)*piVar4);
      Eigen::Matrix<double,-1,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
                ((Matrix<double,_1,1,0,3,1> *)(local_70 + 0x20),
                 (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)&local_e0);
      point_segment_squared_distance
                (pVVar1,(array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)local_70,
                 (VectorMax3d *)sq_d_local,local_30);
    }
    else {
      IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                        (&(this->faces).
                          super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>);
      pVVar1 = pVStack_18;
      if (IVar3 != 3) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                      ,0x22c,
                      "void SimpleBVH::BVH::leaf_callback(const VectorMax3d &, int, VectorMax3d &, double &) const"
                     );
      }
      piVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)&this->faces,
                          (long)np_local._4_4_,0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_178,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->vertices,
                 (long)*piVar4);
      Eigen::Matrix<double,-1,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
                ((Matrix<double,_1,1,0,3,1> *)local_140,
                 (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)&local_178);
      piVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)&this->faces,
                          (long)np_local._4_4_,1);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_1b0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->vertices,
                 (long)*piVar4);
      Eigen::Matrix<double,-1,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
                ((Matrix<double,_1,1,0,3,1> *)(local_140 + 0x20),
                 (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)&local_1b0);
      piVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_0> *)&this->faces,
                          (long)np_local._4_4_,2);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_1e8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->vertices,
                 (long)*piVar4);
      Eigen::Matrix<double,-1,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
                (aMStack_100,
                 (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)&local_1e8);
      point_triangle_squared_distance
                (pVVar1,(array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_3UL> *)local_140,
                 (VectorMax3d *)sq_d_local,local_30);
    }
  }
  return;
}

Assistant:

void BVH::leaf_callback(
    const VectorMax3d& p, int f, VectorMax3d& np, double& sq_d) const
{
    if (leafCallback) {
        leafCallback(p, f, np, sq_d);
        return;
    }

    if (faces.cols() == 2) {
        point_segment_squared_distance(
            p, { { vertices.row(faces(f, 0)), vertices.row(faces(f, 1)) } }, np,
            sq_d);
        return;
    } else if (faces.cols() == 3) {
        point_triangle_squared_distance(
            p,
            { { vertices.row(faces(f, 0)), vertices.row(faces(f, 1)),
                vertices.row(faces(f, 2)) } },
            np, sq_d);
        return;
    }

    assert(false);
}